

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.h
# Opt level: O0

string * pybind11::type_id<pybind11::str>(void)

{
  char *pcVar1;
  string *in_RDI;
  allocator local_12;
  undefined1 local_11;
  string *name;
  
  local_11 = 0;
  pcVar1 = std::type_info::name((type_info *)&str::typeinfo);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,pcVar1,&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  detail::clean_type_id((string *)in_RDI);
  return in_RDI;
}

Assistant:

static std::string type_id() {
    std::string name(typeid(T).name());
    detail::clean_type_id(name);
    return name;
}